

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O3

void google::protobuf::internal::RepeatedFieldHelper<8>::
     Serialize<google::protobuf::internal::ArrayOutput>
               (void *field,FieldMetadata *md,ArrayOutput *output)

{
  uint8_t *puVar1;
  bool *pbVar2;
  int index;
  RepeatedField<bool> *array;
  uint32_t local_2c;
  
  if (0 < *field) {
    index = 0;
    do {
      local_2c = md->tag;
      OutputHelper<google::protobuf::internal::ArrayOutput,_13>::Serialize(&local_2c,output);
      pbVar2 = RepeatedField<bool>::Get((RepeatedField<bool> *)field,index);
      puVar1 = output->ptr;
      *puVar1 = *pbVar2;
      output->ptr = puVar1 + 1;
      index = index + 1;
    } while (index < *field);
  }
  return;
}

Assistant:

static void Serialize(const void* field, const FieldMetadata& md, O* output) {
    typedef typename PrimitiveTypeHelper<type>::Type T;
    const RepeatedField<T>& array = Get<RepeatedField<T> >(field);
    for (int i = 0; i < array.size(); i++) {
      WriteTagTo(md.tag, output);
      SerializeTo<type>(&array[i], output);
    }
  }